

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t avx2_despace(char *bytes,size_t howmany)

{
  undefined1 auVar1 [32];
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [32];
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  size_t j;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  auVar11[8] = 0x20;
  auVar11._0_8_ = 0x2020202020202020;
  auVar11[9] = 0x20;
  auVar11[10] = 0x20;
  auVar11[0xb] = 0x20;
  auVar11[0xc] = 0x20;
  auVar11[0xd] = 0x20;
  auVar11[0xe] = 0x20;
  auVar11[0xf] = 0x20;
  auVar11[0x10] = 0x20;
  auVar11[0x11] = 0x20;
  auVar11[0x12] = 0x20;
  auVar11[0x13] = 0x20;
  auVar11[0x14] = 0x20;
  auVar11[0x15] = 0x20;
  auVar11[0x16] = 0x20;
  auVar11[0x17] = 0x20;
  auVar11[0x18] = 0x20;
  auVar11[0x19] = 0x20;
  auVar11[0x1a] = 0x20;
  auVar11[0x1b] = 0x20;
  auVar11[0x1c] = 0x20;
  auVar11[0x1d] = 0x20;
  auVar11[0x1e] = 0x20;
  auVar11[0x1f] = 0x20;
  auVar12[8] = 10;
  auVar12._0_8_ = 0xa0a0a0a0a0a0a0a;
  auVar12[9] = 10;
  auVar12[10] = 10;
  auVar12[0xb] = 10;
  auVar12[0xc] = 10;
  auVar12[0xd] = 10;
  auVar12[0xe] = 10;
  auVar12[0xf] = 10;
  auVar12[0x10] = 10;
  auVar12[0x11] = 10;
  auVar12[0x12] = 10;
  auVar12[0x13] = 10;
  auVar12[0x14] = 10;
  auVar12[0x15] = 10;
  auVar12[0x16] = 10;
  auVar12[0x17] = 10;
  auVar12[0x18] = 10;
  auVar12[0x19] = 10;
  auVar12[0x1a] = 10;
  auVar12[0x1b] = 10;
  auVar12[0x1c] = 10;
  auVar12[0x1d] = 10;
  auVar12[0x1e] = 10;
  auVar12[0x1f] = 10;
  auVar13[8] = 0xd;
  auVar13._0_8_ = 0xd0d0d0d0d0d0d0d;
  auVar13[9] = 0xd;
  auVar13[10] = 0xd;
  auVar13[0xb] = 0xd;
  auVar13[0xc] = 0xd;
  auVar13[0xd] = 0xd;
  auVar13[0xe] = 0xd;
  auVar13[0xf] = 0xd;
  auVar13[0x10] = 0xd;
  auVar13[0x11] = 0xd;
  auVar13[0x12] = 0xd;
  auVar13[0x13] = 0xd;
  auVar13[0x14] = 0xd;
  auVar13[0x15] = 0xd;
  auVar13[0x16] = 0xd;
  auVar13[0x17] = 0xd;
  auVar13[0x18] = 0xd;
  auVar13[0x19] = 0xd;
  auVar13[0x1a] = 0xd;
  auVar13[0x1b] = 0xd;
  auVar13[0x1c] = 0xd;
  auVar13[0x1d] = 0xd;
  auVar13[0x1e] = 0xd;
  auVar13[0x1f] = 0xd;
  sVar7 = 0;
  pcVar9 = bytes;
  for (uVar8 = 0; (uVar8 | 0x1f) < howmany; uVar8 = uVar8 + 0x20) {
    auVar1 = *(undefined1 (*) [32])(bytes + uVar8);
    uVar3 = vpcmpeqb_avx512vl(auVar1,auVar11);
    uVar4 = vpcmpeqb_avx512vl(auVar1,auVar12);
    uVar5 = vpcmpeqb_avx512vl(auVar1,auVar13);
    auVar6 = vpmovm2b_avx512vl((ulong)((uint)uVar3 | (uint)uVar4 | (uint)uVar5));
    if (auVar6 == (undefined1  [32])0x0) {
      *(undefined1 (*) [32])(bytes + sVar7) = auVar1;
      sVar7 = sVar7 + 0x20;
    }
    else {
      for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
        bVar2 = pcVar9[lVar10];
        if ((0x20 < (ulong)bVar2) || ((0x100002400U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          bytes[sVar7] = bVar2;
          sVar7 = sVar7 + 1;
        }
      }
    }
    pcVar9 = pcVar9 + 0x20;
  }
  for (; uVar8 < howmany; uVar8 = uVar8 + 1) {
    bVar2 = bytes[uVar8];
    if ((0x20 < (ulong)bVar2) || ((0x100002400U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
      bytes[sVar7] = bVar2;
      sVar7 = sVar7 + 1;
    }
  }
  return sVar7;
}

Assistant:

size_t avx2_despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m256i spaces = _mm256_set1_epi8(' ');
  __m256i newline = _mm256_set1_epi8('\n');
  __m256i carriage = _mm256_set1_epi8('\r');
  size_t i = 0;
  for (; i + 31 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    // we do it the naive way, could be smarter?
    __m256i xspaces = _mm256_cmpeq_epi8(x, spaces);
    __m256i xnewline = _mm256_cmpeq_epi8(x, newline);
    __m256i xcarriage = _mm256_cmpeq_epi8(x, carriage);
    __m256i anywhite =
        _mm256_or_si256(_mm256_or_si256(xspaces, xnewline), xcarriage);
    if (_mm256_testz_si256(anywhite, anywhite) == 1) { // no white space
      _mm256_storeu_si256((__m256i *)(bytes + pos), x);
      pos += 32;
    } else {
      // do it the hard way
      for (size_t j = 0; j < 32; j++) {
        char c = bytes[i + j];
        if (c == '\r' || c == '\n' || c == ' ') {
          continue;
        }
        bytes[pos++] = c;
      }
    }
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}